

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setPadPosition(DecimalFormat *this,EPadPosition padPos)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (((pDVar1->padPosition).fNull != false) || ((pDVar1->padPosition).fValue != padPos)) {
    (pDVar1->padPosition).fValue = padPos;
    (pDVar1->padPosition).fNull = false;
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setPadPosition(EPadPosition padPos) {
    auto uPadPos = static_cast<UNumberFormatPadPosition>(padPos);
    if (!fields->properties->padPosition.isNull() && uPadPos == fields->properties->padPosition.getNoError()) {
        return;
    }
    fields->properties->padPosition = uPadPos;
    touchNoError();
}